

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionContext::BlindTransactionWithDirectKey
          (ConfidentialTransactionContext *this,
          map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
          *utxo_info_map,
          map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
          *issuance_key_map,
          vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
          *confidential_address_list,
          vector<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>
          *confidential_key_list,int64_t minimum_range_value,int exponent,int minimum_bits,
          vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *blinder_list)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  pointer ppVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ConfidentialTransaction *in_RDI;
  undefined8 in_R8;
  int64_t in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>,_bool>
  pVar6;
  int in_stack_00000008;
  int in_stack_00000010;
  vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *in_stack_00000018;
  ByteData nonce;
  string script;
  value_type *txout;
  ConfidentialKeyBlindParameter *data;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>
  *__range2_3;
  ElementsConfidentialAddress *ct_addr;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  *__range2_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
  ct_map;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> confidential_keys;
  pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair> *key_info;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
  *__range2_1;
  vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  issuance_blinding_keys;
  pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter> *utxo_info;
  const_iterator __end2;
  const_iterator __begin2;
  map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
  *__range2;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> txin_info_list;
  uint32_t index;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  Address *in_stack_fffffffffffffb40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb48;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  size_type in_stack_fffffffffffffb58;
  Pubkey *pPVar7;
  vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  *in_stack_fffffffffffffb60;
  ByteData local_430;
  Pubkey local_418;
  ConfidentialNonce local_400;
  ByteData local_3d8;
  _Base_ptr local_3c0;
  _Self local_3b8;
  _Self local_3b0;
  Script local_3a8;
  string local_370;
  reference local_350;
  reference local_348;
  ConfidentialKeyBlindParameter *local_340;
  __normal_iterator<const_cfd::ConfidentialKeyBlindParameter_*,_std::vector<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>_>
  local_338;
  undefined8 local_330;
  _Base_ptr local_328;
  undefined1 local_320;
  ConfidentialKey local_318;
  Address local_300;
  Script local_180;
  string local_148;
  reference local_128;
  ElementsConfidentialAddress *local_120;
  __normal_iterator<const_cfd::core::ElementsConfidentialAddress_*,_std::vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>_>
  local_118;
  undefined8 local_110;
  allocator_type local_d1;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_d0;
  reference local_b8;
  _Self local_b0;
  _Self local_a8;
  undefined8 local_a0;
  vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  local_98;
  reference local_80;
  _Self local_78;
  _Self local_70;
  undefined8 local_68;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> local_50;
  uint local_34;
  int64_t local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_34 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::vector
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             0x57f135);
  bVar2 = std::
          map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
          ::empty((map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
                   *)0x57f142);
  if (!bVar2) {
    std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::size
              (&in_RDI->vin_);
    std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::resize
              ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
               in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    local_68 = local_10;
    local_70._M_node =
         (_Base_ptr)
         std::
         map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
         ::begin((map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    local_78._M_node =
         (_Base_ptr)
         std::
         map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
         ::end((map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
                *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    while (bVar2 = std::operator!=(&local_70,&local_78), bVar2) {
      local_80 = std::
                 _Rb_tree_const_iterator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>
                 ::operator*((_Rb_tree_const_iterator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>
                              *)in_stack_fffffffffffffb40);
      local_34 = (*(in_RDI->super_AbstractTransaction)._vptr_AbstractTransaction[0xf])
                           (in_RDI,local_80);
      std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
      operator[](&local_50,(ulong)local_34);
      core::UnblindParameter::operator=
                ((UnblindParameter *)in_stack_fffffffffffffb40,
                 (UnblindParameter *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      std::
      _Rb_tree_const_iterator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>::
      operator++((_Rb_tree_const_iterator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>
                  *)in_stack_fffffffffffffb40);
    }
  }
  std::
  vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>::
  vector(&local_98);
  bVar2 = std::
          map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
          ::empty((map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
                   *)0x57f28f);
  if (!bVar2) {
    std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::size
              (&in_RDI->vin_);
    std::
    vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
    ::resize(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    local_a0 = local_18;
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
         ::begin((map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
         ::end((map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
                *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    while (bVar2 = std::operator!=(&local_a8,&local_b0), bVar2) {
      local_b8 = std::
                 _Rb_tree_const_iterator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>
                 ::operator*((_Rb_tree_const_iterator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>
                              *)in_stack_fffffffffffffb40);
      local_34 = (*(in_RDI->super_AbstractTransaction)._vptr_AbstractTransaction[0xf])
                           (in_RDI,local_b8);
      std::
      vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
      ::operator[](&local_98,(ulong)local_34);
      core::IssuanceBlindingKeyPair::operator=
                ((IssuanceBlindingKeyPair *)in_stack_fffffffffffffb40,
                 (IssuanceBlindingKeyPair *)
                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      std::
      _Rb_tree_const_iterator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>
                    *)in_stack_fffffffffffffb40);
    }
  }
  sVar3 = std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
          size(&in_RDI->vout_);
  std::allocator<cfd::core::Pubkey>::allocator((allocator<cfd::core::Pubkey> *)0x57f3de);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_d0,sVar3,&local_d1);
  std::allocator<cfd::core::Pubkey>::~allocator((allocator<cfd::core::Pubkey> *)0x57f404);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
         *)0x57f411);
  bVar2 = std::
          vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
          ::empty((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
                   *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  if (!bVar2) {
    local_110 = local_20;
    local_118._M_current =
         (ElementsConfidentialAddress *)
         std::
         vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
         ::begin((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
                  *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    local_120 = (ElementsConfidentialAddress *)
                std::
                vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
                ::end((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
                       *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::core::ElementsConfidentialAddress_*,_std::vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>_>
                               *)in_stack_fffffffffffffb40,
                              (__normal_iterator<const_cfd::core::ElementsConfidentialAddress_*,_std::vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38)),
          bVar2) {
      local_128 = __gnu_cxx::
                  __normal_iterator<const_cfd::core::ElementsConfidentialAddress_*,_std::vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>_>
                  ::operator*(&local_118);
      core::ElementsConfidentialAddress::GetUnblindedAddress(&local_300,local_128);
      core::Address::GetLockingScript(&local_180,&local_300);
      core::Script::GetHex_abi_cxx11_(&local_148,&local_180);
      core::ElementsConfidentialAddress::GetConfidentialKey(&local_318,local_128);
      pVar6 = std::
              map<std::__cxx11::string,cfd::core::Pubkey,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Pubkey>>>
              ::emplace<std::__cxx11::string_const,cfd::core::Pubkey>
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
                          *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                         in_stack_fffffffffffffb48,(Pubkey *)in_stack_fffffffffffffb40);
      local_328 = (_Base_ptr)pVar6.first._M_node;
      local_320 = pVar6.second;
      core::Pubkey::~Pubkey((Pubkey *)0x57f53c);
      std::__cxx11::string::~string((string *)&local_148);
      core::Script::~Script((Script *)in_stack_fffffffffffffb40);
      core::Address::~Address(in_stack_fffffffffffffb40);
      __gnu_cxx::
      __normal_iterator<const_cfd::core::ElementsConfidentialAddress_*,_std::vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>_>
      ::operator++(&local_118);
    }
  }
  bVar2 = std::
          vector<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>
          ::empty((vector<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>
                   *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  if (!bVar2) {
    local_330 = local_28;
    local_338._M_current =
         (ConfidentialKeyBlindParameter *)
         std::
         vector<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>
         ::begin((vector<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>
                  *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    local_340 = (ConfidentialKeyBlindParameter *)
                std::
                vector<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>
                ::end((vector<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>
                       *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::ConfidentialKeyBlindParameter_*,_std::vector<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>_>
                               *)in_stack_fffffffffffffb40,
                              (__normal_iterator<const_cfd::ConfidentialKeyBlindParameter_*,_std::vector<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38)),
          bVar2) {
      local_348 = __gnu_cxx::
                  __normal_iterator<const_cfd::ConfidentialKeyBlindParameter_*,_std::vector<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>_>
                  ::operator*(&local_338);
      uVar1 = local_348->index;
      sVar3 = std::
              vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
              size(&in_RDI->vout_);
      if (uVar1 < (uint)sVar3) {
        pPVar7 = &local_348->confidential_key;
        pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                           (&local_d0,(ulong)local_348->index);
        core::Pubkey::operator=(pvVar4,pPVar7);
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::ConfidentialKeyBlindParameter_*,_std::vector<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>_>
      ::operator++(&local_338);
    }
  }
  for (local_34 = 0; uVar1 = local_34,
      sVar3 = std::
              vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
              size(&in_RDI->vout_), uVar1 < (uint)sVar3; local_34 = local_34 + 1) {
    local_350 = std::
                vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                ::operator[](&in_RDI->vout_,(ulong)local_34);
    core::AbstractTxOut::GetLockingScript(&local_3a8,&local_350->super_AbstractTxOut);
    core::Script::GetHex_abi_cxx11_(&local_370,&local_3a8);
    core::Script::~Script((Script *)in_stack_fffffffffffffb40);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       (&local_d0,(ulong)local_34);
    bVar2 = core::Pubkey::IsValid(pvVar4);
    if (!bVar2) {
      local_3b0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
                   *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                  (key_type *)0x57f857);
      local_3b8._M_node =
           (_Base_ptr)
           std::
           end<std::map<std::__cxx11::string,cfd::core::Pubkey,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Pubkey>>>>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
                       *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      bVar2 = std::operator!=(&local_3b0,&local_3b8);
      if (bVar2) {
        local_3c0 = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
                    ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
                            *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                           (key_type *)0x57f8bc);
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>
                               *)0x57f8dd);
        pPVar7 = &ppVar5->second;
        pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                           (&local_d0,(ulong)local_34);
        core::Pubkey::operator=(pvVar4,pPVar7);
      }
      else {
        core::ConfidentialTxOut::GetNonce(&local_400,local_350);
        core::ConfidentialNonce::GetData(&local_3d8,&local_400);
        core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x57f94b);
        in_stack_fffffffffffffb57 = core::Pubkey::IsValid(&local_3d8);
        if ((bool)in_stack_fffffffffffffb57) {
          core::ByteData::ByteData
                    ((ByteData *)in_stack_fffffffffffffb40,
                     (ByteData *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          core::Pubkey::Pubkey(&local_418,&local_430);
          pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                             (&local_d0,(ulong)local_34);
          core::Pubkey::operator=(pvVar4,&local_418);
          core::Pubkey::~Pubkey((Pubkey *)0x57f9ce);
          core::ByteData::~ByteData((ByteData *)0x57f9db);
        }
        core::ByteData::~ByteData((ByteData *)0x57fa6f);
      }
    }
    std::__cxx11::string::~string((string *)&local_370);
  }
  core::ConfidentialTransaction::BlindTransaction
            (in_RDI,&local_50,&local_98,&local_d0,local_30,in_stack_00000008,in_stack_00000010,
             in_stack_00000018);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
          *)0x57fb13);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  std::
  vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>::
  ~vector(&local_98);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::~vector
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  return;
}

Assistant:

void ConfidentialTransactionContext::BlindTransactionWithDirectKey(
    const std::map<OutPoint, BlindParameter>& utxo_info_map,
    const std::map<OutPoint, IssuanceBlindingKeyPair>& issuance_key_map,
    const std::vector<ElementsConfidentialAddress>& confidential_address_list,
    const std::vector<ConfidentialKeyBlindParameter>& confidential_key_list,
    int64_t minimum_range_value, int exponent, int minimum_bits,
    std::vector<BlindData>* blinder_list) {
  uint32_t index = 0;
  std::vector<BlindParameter> txin_info_list;
  if (!utxo_info_map.empty()) {
    txin_info_list.resize(vin_.size());
    for (const auto& utxo_info : utxo_info_map) {
      index = GetTxInIndex(utxo_info.first);
      txin_info_list[index] = utxo_info.second;
    }
  }

  std::vector<IssuanceBlindingKeyPair> issuance_blinding_keys;
  if (!issuance_key_map.empty()) {
    issuance_blinding_keys.resize(vin_.size());
    for (const auto& key_info : issuance_key_map) {
      index = GetTxInIndex(key_info.first);
      issuance_blinding_keys[index] = key_info.second;
    }
  }

  std::vector<Pubkey> confidential_keys(vout_.size());
  std::map<std::string, Pubkey> ct_map;
  if (!confidential_address_list.empty()) {
    for (const auto& ct_addr : confidential_address_list) {
      ct_map.emplace(
          ct_addr.GetUnblindedAddress().GetLockingScript().GetHex(),
          ct_addr.GetConfidentialKey());
    }
  }
  if (!confidential_key_list.empty()) {
    for (const auto& data : confidential_key_list) {
      if (data.index < static_cast<uint32_t>(vout_.size())) {
        confidential_keys[data.index] = data.confidential_key;
      }
    }
  }
  for (index = 0; index < static_cast<uint32_t>(vout_.size()); ++index) {
    const auto& txout = vout_[index];
    std::string script = txout.GetLockingScript().GetHex();
    if (confidential_keys[index].IsValid()) {
      // do nothing
    } else if (ct_map.find(script) != std::end(ct_map)) {
      confidential_keys[index] = ct_map.find(script)->second;
    } else {
      ByteData nonce = txout.GetNonce().GetData();
      if (Pubkey::IsValid(nonce)) {
        confidential_keys[index] = Pubkey(nonce);
      }
    }
  }

  BlindTransaction(
      txin_info_list, issuance_blinding_keys, confidential_keys,
      minimum_range_value, exponent, minimum_bits, blinder_list);
}